

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteAttributeNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI,
              xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = -1;
  if ((name != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) && (*name != '\0')) {
    iVar1 = xmlTextWriterStartAttributeNS(writer,prefix,name,namespaceURI);
    if (-1 < iVar1) {
      iVar2 = xmlTextWriterWriteString(writer,content);
      if (-1 < iVar2) {
        iVar3 = xmlTextWriterEndAttribute(writer);
        if (-1 < iVar3) {
          iVar4 = iVar2 + iVar1 + iVar3;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlTextWriterWriteAttributeNS(xmlTextWriterPtr writer,
                              const xmlChar * prefix, const xmlChar * name,
                              const xmlChar * namespaceURI,
                              const xmlChar * content)
{
    int count;
    int sum;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    sum = 0;
    count = xmlTextWriterStartAttributeNS(writer, prefix, name, namespaceURI);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterEndAttribute(writer);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}